

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O1

int run_test_semaphore_2(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_sem_t *loop;
  uv_loop_t *puVar2;
  uv_sem_t *sem;
  int iVar3;
  uv_tcp_t *puVar4;
  uv_pipe_t *handle;
  uv_connect_t *loop_00;
  uv_thread_t thread;
  worker_config_conflict1 wc;
  uv_pipe_t uStack_2c0;
  uv_sem_t *puStack_1b8;
  code *pcStack_1b0;
  sockaddr_in sStack_1a0;
  uv_tcp_t uStack_190;
  uv_sem_t *puStack_98;
  uv_sem_t uStack_90;
  uv_sem_t *puStack_70;
  uv_thread_t local_60;
  uv_mutex_t local_58;
  uv_sem_t uStack_30;
  undefined8 uStack_10;
  
  sem = &uStack_30;
  uStack_30._24_8_ = 0;
  uStack_30._8_8_ = 0;
  uStack_30._16_8_ = 0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  uStack_30.__align = 0;
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  uStack_10 = 100;
  puStack_70 = (uv_sem_t *)0x167b60;
  iVar1 = uv_sem_init(sem,0);
  if (iVar1 == 0) {
    puStack_70 = (uv_sem_t *)0x167b6e;
    iVar1 = uv_mutex_init(&local_58);
    if (iVar1 != 0) goto LAB_00167bc1;
    puStack_70 = (uv_sem_t *)0x167b88;
    iVar1 = uv_thread_create(&local_60,worker,&local_58);
    if (iVar1 != 0) goto LAB_00167bc6;
    puStack_70 = (uv_sem_t *)0x167b94;
    uv_sem_wait(sem);
    puStack_70 = (uv_sem_t *)0x167b9e;
    iVar1 = uv_thread_join(&local_60);
    if (iVar1 == 0) {
      puStack_70 = (uv_sem_t *)0x167bac;
      uv_mutex_destroy(&local_58);
      puStack_70 = (uv_sem_t *)0x167bb4;
      uv_sem_destroy(sem);
      return 0;
    }
  }
  else {
    puStack_70 = (uv_sem_t *)0x167bc1;
    run_test_semaphore_2_cold_1();
LAB_00167bc1:
    puStack_70 = (uv_sem_t *)0x167bc6;
    run_test_semaphore_2_cold_2();
LAB_00167bc6:
    puStack_70 = (uv_sem_t *)0x167bcb;
    run_test_semaphore_2_cold_3();
  }
  puStack_70 = (uv_sem_t *)run_test_semaphore_3;
  run_test_semaphore_2_cold_4();
  loop = &uStack_90;
  puStack_98 = (uv_sem_t *)0x167be2;
  puStack_70 = sem;
  iVar1 = uv_sem_init(&uStack_90,3);
  if (iVar1 == 0) {
    puStack_98 = (uv_sem_t *)0x167bf1;
    uv_sem_wait(&uStack_90);
    puStack_98 = (uv_sem_t *)0x167bf9;
    uv_sem_wait(&uStack_90);
    puStack_98 = (uv_sem_t *)0x167c01;
    iVar1 = uv_sem_trywait(&uStack_90);
    sem = &uStack_90;
    if (iVar1 != 0) goto LAB_00167c4b;
    puStack_98 = (uv_sem_t *)0x167c0d;
    iVar1 = uv_sem_trywait(&uStack_90);
    sem = &uStack_90;
    if (iVar1 != -0xb) goto LAB_00167c50;
    puStack_98 = (uv_sem_t *)0x167c1d;
    uv_sem_post(&uStack_90);
    puStack_98 = (uv_sem_t *)0x167c25;
    iVar1 = uv_sem_trywait(&uStack_90);
    if (iVar1 != 0) goto LAB_00167c55;
    puStack_98 = (uv_sem_t *)0x167c31;
    iVar1 = uv_sem_trywait(&uStack_90);
    loop = &uStack_90;
    if (iVar1 == -0xb) {
      puStack_98 = (uv_sem_t *)0x167c3e;
      uv_sem_destroy(&uStack_90);
      return 0;
    }
  }
  else {
    puStack_98 = (uv_sem_t *)0x167c4b;
    run_test_semaphore_3_cold_1();
LAB_00167c4b:
    puStack_98 = (uv_sem_t *)0x167c50;
    run_test_semaphore_3_cold_2();
LAB_00167c50:
    loop = sem;
    puStack_98 = (uv_sem_t *)0x167c55;
    run_test_semaphore_3_cold_3();
LAB_00167c55:
    puStack_98 = (uv_sem_t *)0x167c5a;
    run_test_semaphore_3_cold_4();
  }
  puStack_98 = (uv_sem_t *)0x167c5f;
  run_test_semaphore_3_cold_5();
  loop_00 = (uv_connect_t *)0x1a4b5a;
  iVar3 = 0x23a3;
  pcStack_1b0 = (code *)0x167c7e;
  puStack_98 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_1a0);
  if (iVar1 == 0) {
    pcStack_1b0 = (code *)0x167c8b;
    loop_00 = (uv_connect_t *)uv_default_loop();
    puVar4 = &uStack_190;
    pcStack_1b0 = (code *)0x167c98;
    iVar1 = uv_tcp_init((uv_loop_t *)loop_00,puVar4);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167d33;
    loop_00 = &connect_req;
    puVar4 = &uStack_190;
    pcStack_1b0 = (code *)0x167cbd;
    iVar1 = uv_tcp_connect(&connect_req,puVar4,(sockaddr *)&sStack_1a0,connect_cb);
    iVar3 = (int)puVar4;
    if (iVar1 != 0) goto LAB_00167d38;
    pcStack_1b0 = (code *)0x167cc6;
    loop_00 = (uv_connect_t *)uv_default_loop();
    iVar3 = 0;
    pcStack_1b0 = (code *)0x167cd0;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167d3d;
    if (connect_cb_called != 1) goto LAB_00167d42;
    if (shutdown_cb_called != 1) goto LAB_00167d47;
    if (close_cb_called != 1) goto LAB_00167d4c;
    pcStack_1b0 = (code *)0x167cf4;
    loop = (uv_sem_t *)uv_default_loop();
    pcStack_1b0 = (code *)0x167d08;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    iVar3 = 0;
    pcStack_1b0 = (code *)0x167d12;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    pcStack_1b0 = (code *)0x167d17;
    loop_00 = (uv_connect_t *)uv_default_loop();
    pcStack_1b0 = (code *)0x167d1f;
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_1b0 = (code *)0x167d33;
    run_test_shutdown_close_tcp_cold_1();
LAB_00167d33:
    pcStack_1b0 = (code *)0x167d38;
    run_test_shutdown_close_tcp_cold_2();
LAB_00167d38:
    pcStack_1b0 = (code *)0x167d3d;
    run_test_shutdown_close_tcp_cold_3();
LAB_00167d3d:
    pcStack_1b0 = (code *)0x167d42;
    run_test_shutdown_close_tcp_cold_4();
LAB_00167d42:
    pcStack_1b0 = (code *)0x167d47;
    run_test_shutdown_close_tcp_cold_5();
LAB_00167d47:
    pcStack_1b0 = (code *)0x167d4c;
    run_test_shutdown_close_tcp_cold_6();
LAB_00167d4c:
    pcStack_1b0 = (code *)0x167d51;
    run_test_shutdown_close_tcp_cold_7();
  }
  pcStack_1b0 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (loop_00 == &connect_req) {
    if (iVar3 != 0) goto LAB_00167dc6;
    puStack_1b8 = (uv_sem_t *)0x167d81;
    pcStack_1b0._0_4_ = extraout_EAX;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    if (iVar1 != 0) goto LAB_00167dcb;
    puStack_1b8 = (uv_sem_t *)0x167d91;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 != 0) goto LAB_00167dd0;
    puStack_1b8 = (uv_sem_t *)0x167da8;
    uv_close((uv_handle_t *)connect_req.handle,close_cb);
    puStack_1b8 = (uv_sem_t *)0x167db4;
    iVar1 = uv_is_closing((uv_handle_t *)connect_req.handle);
    if (iVar1 == 1) {
      connect_cb_called = connect_cb_called + 1;
      return (int)pcStack_1b0;
    }
  }
  else {
    puStack_1b8 = (uv_sem_t *)0x167dc6;
    connect_cb_cold_1();
LAB_00167dc6:
    puStack_1b8 = (uv_sem_t *)0x167dcb;
    connect_cb_cold_2();
LAB_00167dcb:
    puStack_1b8 = (uv_sem_t *)0x167dd0;
    connect_cb_cold_3();
LAB_00167dd0:
    puStack_1b8 = (uv_sem_t *)0x167dd5;
    connect_cb_cold_4();
  }
  puStack_1b8 = (uv_sem_t *)run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  puStack_1b8 = loop;
  puVar2 = uv_default_loop();
  handle = &uStack_2c0;
  iVar1 = uv_pipe_init(puVar2,handle,0);
  iVar3 = (int)handle;
  if (iVar1 == 0) {
    uv_pipe_connect(&connect_req,&uStack_2c0,"/tmp/uv-test-sock",connect_cb);
    puVar2 = uv_default_loop();
    iVar3 = 0;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00167e8f;
    if (connect_cb_called != 1) goto LAB_00167e94;
    if (shutdown_cb_called != 1) goto LAB_00167e99;
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00167ea3;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_00167e8f:
    run_test_shutdown_close_pipe_cold_2();
LAB_00167e94:
    run_test_shutdown_close_pipe_cold_3();
LAB_00167e99:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_00167ea3:
  run_test_shutdown_close_pipe_cold_6();
  if (puVar2 == (uv_loop_t *)&shutdown_req) {
    if ((iVar3 == -0x7d) || (iVar3 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(semaphore_2) {
  uv_thread_t thread;
  worker_config wc;

  memset(&wc, 0, sizeof(wc));
  wc.delay = 100;

  ASSERT(0 == uv_sem_init(&wc.sem, 0));
  ASSERT(0 == uv_mutex_init(&wc.mutex));
  ASSERT(0 == uv_thread_create(&thread, worker, &wc));

  uv_sem_wait(&wc.sem);

  ASSERT(0 == uv_thread_join(&thread));
  uv_mutex_destroy(&wc.mutex);
  uv_sem_destroy(&wc.sem);

  return 0;
}